

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall TOIDecPOMDPDiscrete::SoftPrint_abi_cxx11_(TOIDecPOMDPDiscrete *this)

{
  TOIDecPOMDPDiscrete *in_stack_00000218;
  
  SoftPrint_abi_cxx11_(in_stack_00000218);
  return;
}

Assistant:

string TOIDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TransitionObservationIndependentMADPDiscrete::SoftPrint();
    ss << DecPOMDP::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward model: " << endl;
        ss << _m_p_rModel->SoftPrint();
    }
    else
        throw E("TOIDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}